

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  short sVar1;
  int iVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  ulong uVar15;
  ulong uVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  longlong lVar44;
  longlong lVar45;
  ushort uVar46;
  short sVar47;
  ushort uVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  uint uVar52;
  int32_t t;
  int iVar53;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar56;
  __m128i *palVar57;
  undefined4 in_register_00000084;
  longlong lVar58;
  longlong in_R9;
  ushort uVar67;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  ushort uVar65;
  ushort uVar66;
  ushort uVar68;
  ushort uVar69;
  ushort uVar71;
  ushort uVar73;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  longlong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ushort uVar75;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  longlong extraout_XMM0_Qb_02;
  ulong uVar70;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  ushort uVar72;
  ushort uVar74;
  ushort uVar76;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  __m128i alVar77;
  __m128i alVar78;
  __m128i alVar79;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i a_20;
  __m128i a_21;
  __m128i a_22;
  __m128i a_23;
  __m128i a_24;
  __m128i a_25;
  __m128i alVar80;
  __m128i alVar81;
  __m128i alVar82;
  __m128i alVar83;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i b_20;
  __m128i b_21;
  __m128i b_22;
  __m128i b_23;
  __m128i b_24;
  __m128i b_25;
  __m128i b_26;
  __m128i b_27;
  __m128i b_28;
  __m128i b_29;
  __m128i b_30;
  __m128i b_31;
  __m128i b_32;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i mask_06;
  __m128i mask_07;
  __m128i mask_08;
  __m128i mask_09;
  __m128i mask_10;
  __m128i mask_11;
  __m128i mask_12;
  __m128i mask_13;
  __m128i mask_14;
  __m128i mask_15;
  __m128i mask_16;
  __m128i mask_17;
  __m128i mask_18;
  __m128i mask_19;
  __m128i mask_20;
  __m128i mask_21;
  __m128i mask_22;
  __m128i mask_23;
  __m128i mask_24;
  __m128i mask_25;
  ulong uStack_1008;
  __m128i vHL_2;
  __m128i vHS_2;
  __m128i vHM_2;
  __m128i vH_2;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t h;
  int local_d00;
  int local_cfc;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_c50;
  short local_c4e;
  short local_c4c;
  short local_c4a;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_b40;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  short sStack_4d6;
  short sStack_4d4;
  short sStack_4d2;
  short sStack_4d0;
  short sStack_4ce;
  short sStack_4cc;
  short sStack_4ca;
  short local_4c8;
  short sStack_4c6;
  short sStack_4c4;
  short sStack_4c2;
  short sStack_4c0;
  short sStack_4be;
  short sStack_4bc;
  short sStack_4ba;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  short local_488;
  short sStack_486;
  short sStack_484;
  short sStack_482;
  short sStack_480;
  short sStack_47e;
  short sStack_47c;
  short sStack_47a;
  short local_478;
  short sStack_476;
  short sStack_474;
  short sStack_472;
  short sStack_470;
  short sStack_46e;
  short sStack_46c;
  short sStack_46a;
  short local_458;
  short sStack_456;
  short sStack_454;
  short sStack_452;
  short sStack_450;
  short sStack_44e;
  short sStack_44c;
  short sStack_44a;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  size_t len;
  ulong uVar54;
  longlong lVar55;
  
  lVar58 = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16","profile"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_scan_profile_sse2_128_16",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar50 = profile->s1Len;
    local_b40 = iVar50 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar4 = profile->matrix;
    iVar49 = (iVar50 + 7) / 8;
    iVar53 = (iVar50 + -1) % iVar49;
    iVar50 = ~((iVar50 + -1) / iVar49) + 8;
    pvVar5 = (profile->profile16).score;
    pvVar6 = (profile->profile16).matches;
    pvVar7 = (profile->profile16).similar;
    i._0_2_ = (short)open;
    uVar40 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar41 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (short)gap;
    uVar42 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    uVar43 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    if (ppVar4->min <= -open) {
      i._0_2_ = -(short)ppVar4->min;
    }
    uVar46 = (short)i + 0x8001;
    sVar47 = ((ushort)ppVar4->max ^ 0x7fff) - 1;
    lVar44 = CONCAT26(uVar46,CONCAT24(uVar46,CONCAT22(uVar46,uVar46)));
    lVar45 = CONCAT26(uVar46,CONCAT24(uVar46,CONCAT22(uVar46,uVar46)));
    vSaturationCheckMax[1] = CONCAT26(sVar47,CONCAT24(sVar47,CONCAT22(sVar47,sVar47)));
    vSaturationCheckMin[0] = CONCAT26(sVar47,CONCAT24(sVar47,CONCAT22(sVar47,sVar47)));
    position._0_2_ = (ushort)iVar49;
    uVar48 = -(ushort)position * (short)j;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = CONCAT62(0,uVar46);
    auVar59._8_8_ =
         CONCAT26(uVar48,CONCAT24(uVar48,CONCAT22(uVar48,uVar48))) << 0x10 | (ulong)uVar48;
    auVar59._0_8_ = CONCAT26(uVar48,CONCAT24(uVar48,CONCAT22(uVar48,uVar48))) << 0x10;
    auVar59 = paddsw(auVar62,auVar59);
    profile_local = (parasail_profile_t *)parasail_result_new_rowcol3(iVar49 * 8,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x8210401;
      uVar52 = *(uint *)&profile_local->field_0xc | 0x40000;
      len = (size_t)uVar52;
      *(uint *)&profile_local->field_0xc = uVar52;
      b = parasail_memalign___m128i(0x10,(long)iVar49);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar49);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar49);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr = parasail_memalign___m128i(0x10,(long)iVar49);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar49);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar49);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar49);
      ptr_06 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar82[0] = (long)iVar49;
        alVar82[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar82,len);
        alVar83[0] = (long)iVar49;
        alVar83[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar83,len);
        alVar77[0] = (long)iVar49;
        alVar77[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar77,len);
        alVar78[0] = (long)iVar49;
        alVar78[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar78,len);
        alVar79[0] = (long)iVar49;
        alVar79[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar79,len);
        alVar81[0] = (long)iVar49;
        alVar81[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,alVar81,len);
        alVar80[0] = (long)iVar49;
        alVar80[1] = extraout_RDX_05;
        palVar57 = b_02;
        parasail_memset___m128i(b_02,alVar80,len);
        auVar63._8_8_ = uVar41;
        auVar63._0_8_ = uVar40;
        register0x00001200 = psubsw(ZEXT816(0),auVar63);
        vGapperL[0] = 0x1000100010001;
        _segNum = 0x1000100010001;
        k = iVar49;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = vGapperL[1];
          ptr_04[k][1] = vGapper[0];
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          auVar60._8_8_ = uVar43;
          auVar60._0_8_ = uVar42;
          register0x00001200 = psubsw(stack0xfffffffffffff318,auVar60);
          auVar64._8_8_ = 0x1000100010001;
          auVar64._0_8_ = 0x1000100010001;
          _segNum = paddsw(_segNum,auVar64);
        }
        local_cfc = 0;
        for (k = 0; k < iVar49; k = k + 1) {
          for (local_d00 = 0; local_d00 < 8; local_d00 = local_d00 + 1) {
            iVar51 = -(gap * (local_d00 * iVar49 + k)) - open;
            if (iVar51 < -0x8000) {
              iVar51 = -0x8000;
            }
            *(short *)((long)&tmp + (long)local_d00 * 2) = (short)iVar51;
          }
          ptr[local_cfc][0] = tmp;
          ptr[local_cfc][1] = h.m[0];
          local_cfc = local_cfc + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar51 = -(gap * (k + -1)) - open;
          if (iVar51 < -0x8000) {
            iVar51 = -0x8000;
          }
          ptr_06[k] = (int16_t)iVar51;
        }
        vNegInfFront[1] = lVar44;
        vSaturationCheckMax[0] = lVar45;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar54 = ptr[iVar49 + -1][0];
          uVar70 = b_03[iVar49 + -1][0];
          uVar15 = b_04[iVar49 + -1][0];
          uVar16 = b_05[iVar49 + -1][0];
          vHpM[0] = b_03[iVar49 + -1][1] << 0x10 | uVar70 >> 0x30;
          vHpS[1] = uVar70 << 0x10;
          vHpS[0] = b_04[iVar49 + -1][1] << 0x10 | uVar15 >> 0x30;
          vHpL[1] = uVar15 << 0x10;
          vHpL[0] = b_05[iVar49 + -1][1] << 0x10 | uVar16 >> 0x30;
          pvW = (__m128i *)(uVar16 << 0x10);
          vHp[0] = ptr[iVar49 + -1][1] << 0x10 | uVar54 >> 0x30;
          vHpM[1] = uVar54 << 0x10 | (ulong)(ushort)ptr_06[s1Len];
          iVar51 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar4->mapper[(byte)s2[s1Len]];
          lVar56 = (long)s1Len;
          uVar54 = (ulong)(byte)s2[lVar56];
          iVar3 = ppVar4->mapper[uVar54];
          auVar61._8_8_ = lVar45;
          auVar61._0_8_ = lVar44;
          register0x00001200 = psubsw(auVar61,(undefined1  [16])*ptr_04);
          vF[0] = lVar45;
          vF_ext[1] = lVar44;
          k = 0;
          while( true ) {
            auVar62 = stack0xfffffffffffff268;
            local_448 = (short)vF_ext[1];
            sStack_446 = vF_ext[1]._2_2_;
            sStack_444 = vF_ext[1]._4_2_;
            sStack_442 = vF_ext[1]._6_2_;
            sStack_440 = (short)vF_ext[2];
            sStack_43e = vF_ext[2]._2_2_;
            sStack_43c = vF_ext[2]._4_2_;
            sStack_43a = vF_ext[2]._6_2_;
            if (iVar49 <= k) break;
            alVar83 = ptr[k];
            alVar77 = b_03[k];
            alVar78 = b_04[k];
            alVar79 = b_05[k];
            auVar62 = *(undefined1 (*) [16])
                       ((long)pvVar5 + (long)k * 0x10 + (long)(iVar51 * iVar49) * 0x10);
            auVar63 = *(undefined1 (*) [16])
                       ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar49) * 0x10);
            auVar64 = *(undefined1 (*) [16])
                       ((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar49) * 0x10);
            alVar81 = ptr_04[k];
            b_06[1] = (long)k * 0x10;
            alVar82 = ptr_05[k];
            auVar38._8_8_ = uVar41;
            auVar38._0_8_ = uVar40;
            auVar60 = psubsw((undefined1  [16])ptr[k],auVar38);
            auVar37._8_8_ = uVar43;
            auVar37._0_8_ = uVar42;
            auVar61 = psubsw((undefined1  [16])b[k],auVar37);
            local_428 = auVar60._0_2_;
            sStack_426 = auVar60._2_2_;
            sStack_424 = auVar60._4_2_;
            sStack_422 = auVar60._6_2_;
            sStack_420 = auVar60._8_2_;
            sStack_41e = auVar60._10_2_;
            sStack_41c = auVar60._12_2_;
            sStack_41a = auVar60._14_2_;
            local_438 = auVar61._0_2_;
            sStack_436 = auVar61._2_2_;
            sStack_434 = auVar61._4_2_;
            sStack_432 = auVar61._6_2_;
            sStack_430 = auVar61._8_2_;
            sStack_42e = auVar61._10_2_;
            sStack_42c = auVar61._12_2_;
            sStack_42a = auVar61._14_2_;
            uVar48 = (ushort)(local_428 < local_438) * local_438 |
                     (ushort)(local_428 >= local_438) * local_428;
            uVar65 = (ushort)(sStack_426 < sStack_436) * sStack_436 |
                     (ushort)(sStack_426 >= sStack_436) * sStack_426;
            uVar66 = (ushort)(sStack_424 < sStack_434) * sStack_434 |
                     (ushort)(sStack_424 >= sStack_434) * sStack_424;
            uVar67 = (ushort)(sStack_422 < sStack_432) * sStack_432 |
                     (ushort)(sStack_422 >= sStack_432) * sStack_422;
            uVar68 = (ushort)(sStack_420 < sStack_430) * sStack_430 |
                     (ushort)(sStack_420 >= sStack_430) * sStack_420;
            uVar71 = (ushort)(sStack_41e < sStack_42e) * sStack_42e |
                     (ushort)(sStack_41e >= sStack_42e) * sStack_41e;
            uVar73 = (ushort)(sStack_41c < sStack_42c) * sStack_42c |
                     (ushort)(sStack_41c >= sStack_42c) * sStack_41c;
            uVar75 = (ushort)(sStack_41a < sStack_42a) * sStack_42a |
                     (ushort)(sStack_41a >= sStack_42a) * sStack_41a;
            vE_ext[1] = CONCAT26(uVar67,CONCAT24(uVar66,CONCAT22(uVar65,uVar48)));
            vE[0] = CONCAT26(uVar75,CONCAT24(uVar73,CONCAT22(uVar71,uVar68)));
            a[1] = lVar56;
            a[0] = (longlong)palVar57;
            b_06[0] = uVar54;
            mask[1] = in_R9;
            mask[0] = lVar58;
            alVar80 = _mm_blendv_epi8_rpl(a,b_06,mask);
            b_07[0] = alVar80[1];
            a_00[1] = lVar56;
            a_00[0] = (longlong)palVar57;
            b_07[1] = b_06[1];
            mask_00[1] = in_R9;
            mask_00[0] = lVar58;
            alVar80 = _mm_blendv_epi8_rpl(a_00,b_07,mask_00);
            b_08[0] = alVar80[1];
            a_01[1] = lVar56;
            a_01[0] = (longlong)palVar57;
            b_08[1] = b_06[1];
            mask_01[1] = in_R9;
            mask_01[0] = lVar58;
            alVar80 = _mm_blendv_epi8_rpl(a_01,b_08,mask_01);
            b_09[0] = alVar80[1];
            auVar33._8_8_ = extraout_XMM0_Qb_01;
            auVar33._0_8_ = extraout_XMM0_Qa_01;
            auVar32._8_8_ = 0x1000100010001;
            auVar32._0_8_ = 0x1000100010001;
            auVar60 = paddsw(auVar33,auVar32);
            auVar61 = paddsw(stack0xfffffffffffff268,(undefined1  [16])alVar81);
            local_458 = auVar61._0_2_;
            sStack_456 = auVar61._2_2_;
            sStack_454 = auVar61._4_2_;
            sStack_452 = auVar61._6_2_;
            sStack_450 = auVar61._8_2_;
            sStack_44e = auVar61._10_2_;
            sStack_44c = auVar61._12_2_;
            sStack_44a = auVar61._14_2_;
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_446 < sStack_456) * sStack_456 |
                          (ushort)(sStack_446 >= sStack_456) * sStack_446,
                          (ushort)(local_448 < local_458) * local_458 |
                          (ushort)(local_448 >= local_458) * local_448);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_444 < sStack_454) * sStack_454 |
                          (ushort)(sStack_444 >= sStack_454) * sStack_444,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_442 < sStack_452) * sStack_452 |
                                 (ushort)(sStack_442 >= sStack_452) * sStack_442,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_440 < sStack_450) * sStack_450 |
                          (ushort)(sStack_440 >= sStack_450) * sStack_440;
            vF[0]._2_2_ = (ushort)(sStack_43e < sStack_44e) * sStack_44e |
                          (ushort)(sStack_43e >= sStack_44e) * sStack_43e;
            vF[0]._4_2_ = (ushort)(sStack_43c < sStack_44c) * sStack_44c |
                          (ushort)(sStack_43c >= sStack_44c) * sStack_43c;
            vF[0]._6_2_ = (ushort)(sStack_43a < sStack_44a) * sStack_44a |
                          (ushort)(sStack_43a >= sStack_44a) * sStack_43a;
            a_02[1] = lVar56;
            a_02[0] = (longlong)palVar57;
            b_09[1] = b_06[1];
            mask_02[1] = in_R9;
            mask_02[0] = lVar58;
            alVar81 = _mm_blendv_epi8_rpl(a_02,b_09,mask_02);
            b_10[0] = alVar81[1];
            a_03[1] = lVar56;
            a_03[0] = (longlong)palVar57;
            b_10[1] = b_06[1];
            mask_03[1] = in_R9;
            mask_03[0] = lVar58;
            alVar81 = _mm_blendv_epi8_rpl(a_03,b_10,mask_03);
            b_11[0] = alVar81[1];
            auVar31._8_8_ = vHtL[0];
            auVar31._0_8_ = vF[1];
            paddsw(auVar31,(undefined1  [16])alVar82);
            a_04[1] = lVar56;
            a_04[0] = (longlong)palVar57;
            b_11[1] = b_06[1];
            mask_04[1] = in_R9;
            mask_04[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_04,b_11,mask_04);
            b_12[0] = alVar82[1];
            auVar62 = paddsw((undefined1  [16])stack0xfffffffffffff188,auVar62);
            auVar63 = paddsw((undefined1  [16])stack0xfffffffffffff178,auVar63);
            auVar64 = paddsw((undefined1  [16])stack0xfffffffffffff168,auVar64);
            auVar30._8_8_ = 0x1000100010001;
            auVar30._0_8_ = 0x1000100010001;
            auVar61 = paddsw((undefined1  [16])_pvW,auVar30);
            vHpM[1] = auVar62._0_8_;
            vHp[0] = auVar62._8_8_;
            local_478 = auVar62._0_2_;
            sStack_476 = auVar62._2_2_;
            sStack_474 = auVar62._4_2_;
            sStack_472 = auVar62._6_2_;
            sStack_470 = auVar62._8_2_;
            sStack_46e = auVar62._10_2_;
            sStack_46c = auVar62._12_2_;
            sStack_46a = auVar62._14_2_;
            vHtM[1] = CONCAT26((ushort)((short)uVar67 < sStack_472) * sStack_472 |
                               ((short)uVar67 >= sStack_472) * uVar67,
                               CONCAT24((ushort)((short)uVar66 < sStack_474) * sStack_474 |
                                        ((short)uVar66 >= sStack_474) * uVar66,
                                        CONCAT22((ushort)((short)uVar65 < sStack_476) * sStack_476 |
                                                 ((short)uVar65 >= sStack_476) * uVar65,
                                                 (ushort)((short)uVar48 < local_478) * local_478 |
                                                 ((short)uVar48 >= local_478) * uVar48)));
            vHt[0]._0_2_ = (ushort)((short)uVar68 < sStack_470) * sStack_470 |
                           ((short)uVar68 >= sStack_470) * uVar68;
            vHt[0]._2_2_ = (ushort)((short)uVar71 < sStack_46e) * sStack_46e |
                           ((short)uVar71 >= sStack_46e) * uVar71;
            vHt[0]._4_2_ = (ushort)((short)uVar73 < sStack_46c) * sStack_46c |
                           ((short)uVar73 >= sStack_46c) * uVar73;
            vHt[0]._6_2_ = (ushort)((short)uVar75 < sStack_46a) * sStack_46a |
                           ((short)uVar75 >= sStack_46a) * uVar75;
            a_05[1] = lVar56;
            a_05[0] = (longlong)palVar57;
            b_12[1] = b_06[1];
            mask_05[1] = in_R9;
            mask_05[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_05,b_12,mask_05);
            b_13[0] = alVar82[1];
            a_06[1] = lVar56;
            a_06[0] = (longlong)palVar57;
            b_13[1] = b_06[1];
            mask_06[1] = in_R9;
            mask_06[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_06,b_13,mask_06);
            b_14[0] = alVar82[1];
            a_07[1] = lVar56;
            a_07[0] = (longlong)palVar57;
            b_14[1] = b_06[1];
            mask_07[1] = in_R9;
            mask_07[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_07,b_14,mask_07);
            uVar54 = alVar82[1];
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = extraout_XMM0_Qa;
            b_00[k][1] = extraout_XMM0_Qb;
            b_01[k][0] = extraout_XMM0_Qa_00;
            b_01[k][1] = extraout_XMM0_Qb_00;
            vHt[1] = auVar60._0_8_;
            vEL[0] = auVar60._8_8_;
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            vHpS[1] = auVar63._0_8_;
            vHpM[0] = auVar63._8_8_;
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            vHpL[1] = auVar64._0_8_;
            vHpS[0] = auVar64._8_8_;
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            pvW = auVar61._0_8_;
            vHpL[0] = auVar61._8_8_;
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            _pvW = alVar79;
            unique0x10005607 = alVar78;
            unique0x10005627 = alVar77;
            unique0x10005647 = alVar83;
            vF[1] = extraout_XMM0_Qa_02;
            vHtL[0] = extraout_XMM0_Qb_02;
          }
          uVar70 = vHt[0] << 0x10 | (ulong)vHtM[1] >> 0x30;
          vHt[0] = uVar70;
          vHtM[1] = vHtM[1] << 0x10;
          vHtL[0] = vHtL[0] << 0x10 | (ulong)vF[1] >> 0x30;
          b_15[1] = (long)s1Len;
          sVar1 = ptr_06[b_15[1] + 1];
          vHtM[1]._0_2_ = sVar1;
          alVar82 = *ptr_05;
          auVar29._8_8_ = uVar70;
          auVar29._0_8_ = vHtM[1];
          auVar63 = paddsw(auVar29,(undefined1  [16])*ptr_04);
          local_488 = auVar63._0_2_;
          sStack_486 = auVar63._2_2_;
          sStack_484 = auVar63._4_2_;
          sStack_482 = auVar63._6_2_;
          sStack_480 = auVar63._8_2_;
          sStack_47e = auVar63._10_2_;
          sStack_47c = auVar63._12_2_;
          sStack_47a = auVar63._14_2_;
          vF_ext[1]._0_4_ =
               CONCAT22((ushort)(sStack_446 < sStack_486) * sStack_486 |
                        (ushort)(sStack_446 >= sStack_486) * sStack_446,
                        (ushort)(local_448 < local_488) * local_488 |
                        (ushort)(local_448 >= local_488) * local_448);
          vF_ext[1]._0_6_ =
               CONCAT24((ushort)(sStack_444 < sStack_484) * sStack_484 |
                        (ushort)(sStack_444 >= sStack_484) * sStack_444,(undefined4)vF_ext[1]);
          vF_ext[1] = CONCAT26((ushort)(sStack_442 < sStack_482) * sStack_482 |
                               (ushort)(sStack_442 >= sStack_482) * sStack_442,(undefined6)vF_ext[1]
                              );
          vF[0]._0_2_ = (ushort)(sStack_440 < sStack_480) * sStack_480 |
                        (ushort)(sStack_440 >= sStack_480) * sStack_440;
          vF[0]._2_2_ = (ushort)(sStack_43e < sStack_47e) * sStack_47e |
                        (ushort)(sStack_43e >= sStack_47e) * sStack_43e;
          vF[0]._4_2_ = (ushort)(sStack_43c < sStack_47c) * sStack_47c |
                        (ushort)(sStack_43c >= sStack_47c) * sStack_43c;
          vF[0]._6_2_ = (ushort)(sStack_43a < sStack_47a) * sStack_47a |
                        (ushort)(sStack_43a >= sStack_47a) * sStack_43a;
          a_08[1] = lVar56;
          a_08[0] = (longlong)palVar57;
          b_15[0] = uVar54;
          mask_08[1] = in_R9;
          mask_08[0] = lVar58;
          alVar83 = _mm_blendv_epi8_rpl(a_08,b_15,mask_08);
          b_16[0] = alVar83[1];
          a_09[1] = lVar56;
          a_09[0] = (longlong)palVar57;
          b_16[1] = b_15[1];
          mask_09[1] = in_R9;
          mask_09[0] = lVar58;
          alVar83 = _mm_blendv_epi8_rpl(a_09,b_16,mask_09);
          b_17[0] = alVar83[1];
          auVar28._8_8_ = vHtL[0];
          auVar28._0_8_ = vF[1] << 0x10;
          paddsw(auVar28,(undefined1  [16])alVar82);
          a_10[1] = lVar56;
          a_10[0] = (longlong)palVar57;
          b_17[1] = b_15[1];
          mask_10[1] = in_R9;
          mask_10[0] = lVar58;
          alVar82 = _mm_blendv_epi8_rpl(a_10,b_17,mask_10);
          lVar55 = alVar82[1];
          k = 0;
          vH[1] = extraout_XMM0_Qa_03;
          vFL[0] = extraout_XMM0_Qb_03;
          while( true ) {
            if (5 < k) break;
            auVar27._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            auVar27._0_8_ = vF_ext[1] << 0x10;
            auVar63 = paddsw(auVar27,auVar59);
            local_4a8 = auVar63._0_2_;
            sStack_4a6 = auVar63._2_2_;
            sStack_4a4 = auVar63._4_2_;
            sStack_4a2 = auVar63._6_2_;
            sStack_4a0 = auVar63._8_2_;
            sStack_49e = auVar63._10_2_;
            sStack_49c = auVar63._12_2_;
            sStack_49a = auVar63._14_2_;
            local_4b8 = (short)vF_ext[1];
            sStack_4b6 = vF_ext[1]._2_2_;
            sStack_4b4 = vF_ext[1]._4_2_;
            sStack_4b2 = vF_ext[1]._6_2_;
            sStack_4b0 = (short)vF_ext[2];
            sStack_4ae = vF_ext[2]._2_2_;
            sStack_4ac = vF_ext[2]._4_2_;
            sStack_4aa = vF_ext[2]._6_2_;
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_4b6 < sStack_4a6) * sStack_4a6 |
                          (ushort)(sStack_4b6 >= sStack_4a6) * sStack_4b6,
                          (ushort)(local_4b8 < local_4a8) * local_4a8 |
                          (ushort)(local_4b8 >= local_4a8) * local_4b8);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_4b4 < sStack_4a4) * sStack_4a4 |
                          (ushort)(sStack_4b4 >= sStack_4a4) * sStack_4b4,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_4b2 < sStack_4a2) * sStack_4a2 |
                                 (ushort)(sStack_4b2 >= sStack_4a2) * sStack_4b2,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_4b0 < sStack_4a0) * sStack_4a0 |
                          (ushort)(sStack_4b0 >= sStack_4a0) * sStack_4b0;
            vF[0]._2_2_ = (ushort)(sStack_4ae < sStack_49e) * sStack_49e |
                          (ushort)(sStack_4ae >= sStack_49e) * sStack_4ae;
            vF[0]._4_2_ = (ushort)(sStack_4ac < sStack_49c) * sStack_49c |
                          (ushort)(sStack_4ac >= sStack_49c) * sStack_4ac;
            vF[0]._6_2_ = (ushort)(sStack_4aa < sStack_49a) * sStack_49a |
                          (ushort)(sStack_4aa >= sStack_49a) * sStack_4aa;
            a_11[1] = lVar56;
            a_11[0] = (longlong)palVar57;
            b_18[1]._0_4_ = 6;
            b_18[0] = lVar55;
            b_18[1]._4_4_ = 0;
            lVar55 = 6;
            mask_11[1] = in_R9;
            mask_11[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_11,b_18,mask_11);
            b_19[0] = alVar82[1];
            a_12[1] = lVar56;
            a_12[0] = (longlong)palVar57;
            b_19[1] = lVar55;
            mask_12[1] = in_R9;
            mask_12[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_12,b_19,mask_12);
            b_20[0] = alVar82[1];
            auVar26._8_8_ = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar26._0_8_ = vH[1] << 0x10;
            auVar25._8_8_ =
                 CONCAT26((ushort)position,
                          CONCAT24((ushort)position,CONCAT22((ushort)position,(ushort)position))) <<
                 0x10 | (ulong)(ushort)position;
            auVar25._0_8_ =
                 CONCAT26((ushort)position,
                          CONCAT24((ushort)position,CONCAT22((ushort)position,(ushort)position))) <<
                 0x10;
            paddsw(auVar26,auVar25);
            a_13[1] = lVar56;
            a_13[0] = (longlong)palVar57;
            b_20[1] = lVar55;
            mask_13[1] = in_R9;
            mask_13[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_13,b_20,mask_13);
            lVar55 = alVar82[1];
            k = k + 1;
            vH[1] = extraout_XMM0_Qa_04;
            vFL[0] = extraout_XMM0_Qb_04;
          }
          auVar24._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
          auVar24._0_8_ = vF_ext[1] << 0x10;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = CONCAT62(0,uVar46);
          register0x00001200 = paddsw(auVar24,auVar23);
          local_4c8 = (short)vF_ext[1];
          sStack_4c6 = vF_ext[1]._2_2_;
          sStack_4c4 = vF_ext[1]._4_2_;
          sStack_4c2 = vF_ext[1]._6_2_;
          sStack_4c0 = (short)vF_ext[2];
          sStack_4be = vF_ext[2]._2_2_;
          sStack_4bc = vF_ext[2]._4_2_;
          sStack_4ba = vF_ext[2]._6_2_;
          sStack_4d6 = auVar62._0_2_;
          sStack_4d4 = auVar62._2_2_;
          sStack_4d2 = auVar62._4_2_;
          sStack_4d0 = auVar62._6_2_;
          sStack_4ce = auVar62._8_2_;
          sStack_4cc = auVar62._10_2_;
          sStack_4ca = auVar62._12_2_;
          vHM[1]._0_4_ = CONCAT22((ushort)(sStack_4c6 < sStack_4d6) * sStack_4d6 |
                                  (ushort)(sStack_4c6 >= sStack_4d6) * sStack_4c6,
                                  (ushort)(local_4c8 < sVar1) * sVar1 |
                                  (ushort)(local_4c8 >= sVar1) * local_4c8);
          vHM[1]._0_6_ = CONCAT24((ushort)(sStack_4c4 < sStack_4d4) * sStack_4d4 |
                                  (ushort)(sStack_4c4 >= sStack_4d4) * sStack_4c4,(undefined4)vHM[1]
                                 );
          vHM[1] = CONCAT26((ushort)(sStack_4c2 < sStack_4d2) * sStack_4d2 |
                            (ushort)(sStack_4c2 >= sStack_4d2) * sStack_4c2,(undefined6)vHM[1]);
          vH[0]._0_4_ = CONCAT22((ushort)(sStack_4be < sStack_4ce) * sStack_4ce |
                                 (ushort)(sStack_4be >= sStack_4ce) * sStack_4be,
                                 (ushort)(sStack_4c0 < sStack_4d0) * sStack_4d0 |
                                 (ushort)(sStack_4c0 >= sStack_4d0) * sStack_4c0);
          vH[0]._0_6_ = CONCAT24((ushort)(sStack_4bc < sStack_4cc) * sStack_4cc |
                                 (ushort)(sStack_4bc >= sStack_4cc) * sStack_4bc,(undefined4)vH[0]);
          vH[0] = CONCAT26((ushort)(sStack_4ba < sStack_4ca) * sStack_4ca |
                           (ushort)(sStack_4ba >= sStack_4ca) * sStack_4ba,(undefined6)vH[0]);
          a_14[1] = lVar56;
          a_14[0] = (longlong)palVar57;
          b_21[1]._0_4_ = 6;
          b_21[0] = lVar55;
          b_21[1]._4_4_ = 0;
          lVar55 = 6;
          mask_14[1] = in_R9;
          mask_14[0] = lVar58;
          alVar82 = _mm_blendv_epi8_rpl(a_14,b_21,mask_14);
          b_22[0] = alVar82[1];
          a_15[1] = lVar56;
          a_15[0] = (longlong)palVar57;
          b_22[1] = lVar55;
          mask_15[1] = in_R9;
          mask_15[0] = lVar58;
          alVar82 = _mm_blendv_epi8_rpl(a_15,b_22,mask_15);
          b_23[0] = alVar82[1];
          a_16[1] = lVar56;
          a_16[0] = (longlong)palVar57;
          b_23[1] = lVar55;
          mask_16[1] = in_R9;
          mask_16[0] = lVar58;
          alVar82 = _mm_blendv_epi8_rpl(a_16,b_23,mask_16);
          lVar55 = alVar82[1];
          for (k = 0; k < iVar49; k = k + 1) {
            lVar17 = ptr[k][0];
            lVar18 = ptr[k][1];
            lVar19 = b[k][0];
            lVar20 = b[k][1];
            b_24[1] = (long)k * 0x10;
            auVar36._8_8_ = vH[0];
            auVar36._0_8_ = vHM[1];
            auVar35._8_8_ = uVar41;
            auVar35._0_8_ = uVar40;
            auVar62 = psubsw(auVar36,auVar35);
            auVar34._8_8_ = uVar43;
            auVar34._0_8_ = uVar42;
            auVar63 = psubsw(stack0xfffffffffffff228,auVar34);
            local_348 = auVar62._0_2_;
            sStack_346 = auVar62._2_2_;
            sStack_344 = auVar62._4_2_;
            sStack_342 = auVar62._6_2_;
            sStack_340 = auVar62._8_2_;
            sStack_33e = auVar62._10_2_;
            sStack_33c = auVar62._12_2_;
            sStack_33a = auVar62._14_2_;
            local_358 = auVar63._0_2_;
            sStack_356 = auVar63._2_2_;
            sStack_354 = auVar63._4_2_;
            sStack_352 = auVar63._6_2_;
            sStack_350 = auVar63._8_2_;
            sStack_34e = auVar63._10_2_;
            sStack_34c = auVar63._12_2_;
            sStack_34a = auVar63._14_2_;
            uVar48 = (ushort)(local_348 < local_358) * local_358 |
                     (ushort)(local_348 >= local_358) * local_348;
            uVar66 = (ushort)(sStack_346 < sStack_356) * sStack_356 |
                     (ushort)(sStack_346 >= sStack_356) * sStack_346;
            uVar68 = (ushort)(sStack_344 < sStack_354) * sStack_354 |
                     (ushort)(sStack_344 >= sStack_354) * sStack_344;
            uVar73 = (ushort)(sStack_342 < sStack_352) * sStack_352 |
                     (ushort)(sStack_342 >= sStack_352) * sStack_342;
            vF[0]._0_2_ = (ushort)(sStack_340 < sStack_350) * sStack_350 |
                          (ushort)(sStack_340 >= sStack_350) * sStack_340;
            vF[0]._2_2_ = (ushort)(sStack_33e < sStack_34e) * sStack_34e |
                          (ushort)(sStack_33e >= sStack_34e) * sStack_33e;
            vF[0]._4_2_ = (ushort)(sStack_33c < sStack_34c) * sStack_34c |
                          (ushort)(sStack_33c >= sStack_34c) * sStack_33c;
            vF[0]._6_2_ = (ushort)(sStack_33a < sStack_34a) * sStack_34a |
                          (ushort)(sStack_33a >= sStack_34a) * sStack_33a;
            vF_ext[1]._0_4_ = CONCAT22(uVar66,uVar48);
            vF_ext[1]._0_6_ = CONCAT24(uVar68,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26(uVar73,(undefined6)vF_ext[1]);
            a_17[1] = lVar56;
            a_17[0] = (longlong)palVar57;
            b_24[0] = lVar55;
            mask_17[1] = in_R9;
            mask_17[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_17,b_24,mask_17);
            b_25[0] = alVar82[1];
            a_18[1] = lVar56;
            a_18[0] = (longlong)palVar57;
            b_25[1] = b_24[1];
            mask_18[1] = in_R9;
            mask_18[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_18,b_25,mask_18);
            b_26[0] = alVar82[1];
            a_19[1] = lVar56;
            a_19[0] = (longlong)palVar57;
            b_26[1] = b_24[1];
            mask_19[1] = in_R9;
            mask_19[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_19,b_26,mask_19);
            b_27[0] = alVar82[1];
            auVar22._8_8_ = extraout_XMM0_Qb_05;
            auVar22._0_8_ = extraout_XMM0_Qa_05;
            auVar21._8_8_ = 0x1000100010001;
            auVar21._0_8_ = 0x1000100010001;
            paddsw(auVar22,auVar21);
            local_368 = (short)lVar17;
            sStack_366 = (short)((ulong)lVar17 >> 0x10);
            sStack_364 = (short)((ulong)lVar17 >> 0x20);
            sStack_362 = (short)((ulong)lVar17 >> 0x30);
            sStack_360 = (short)lVar18;
            sStack_35e = (short)((ulong)lVar18 >> 0x10);
            sStack_35c = (short)((ulong)lVar18 >> 0x20);
            sStack_35a = (short)((ulong)lVar18 >> 0x30);
            local_378 = (short)lVar19;
            sStack_376 = (short)((ulong)lVar19 >> 0x10);
            sStack_374 = (short)((ulong)lVar19 >> 0x20);
            sStack_372 = (short)((ulong)lVar19 >> 0x30);
            sStack_370 = (short)lVar20;
            sStack_36e = (short)((ulong)lVar20 >> 0x10);
            sStack_36c = (short)((ulong)lVar20 >> 0x20);
            sStack_36a = (short)((ulong)lVar20 >> 0x30);
            uVar65 = (ushort)(local_368 < local_378) * local_378 |
                     (ushort)(local_368 >= local_378) * local_368;
            uVar67 = (ushort)(sStack_366 < sStack_376) * sStack_376 |
                     (ushort)(sStack_366 >= sStack_376) * sStack_366;
            uVar71 = (ushort)(sStack_364 < sStack_374) * sStack_374 |
                     (ushort)(sStack_364 >= sStack_374) * sStack_364;
            uVar75 = (ushort)(sStack_362 < sStack_372) * sStack_372 |
                     (ushort)(sStack_362 >= sStack_372) * sStack_362;
            uVar69 = (ushort)(sStack_360 < sStack_370) * sStack_370 |
                     (ushort)(sStack_360 >= sStack_370) * sStack_360;
            uVar72 = (ushort)(sStack_35e < sStack_36e) * sStack_36e |
                     (ushort)(sStack_35e >= sStack_36e) * sStack_35e;
            uVar74 = (ushort)(sStack_35c < sStack_36c) * sStack_36c |
                     (ushort)(sStack_35c >= sStack_36c) * sStack_35c;
            uVar76 = (ushort)(sStack_35a < sStack_36a) * sStack_36a |
                     (ushort)(sStack_35a >= sStack_36a) * sStack_35a;
            uVar48 = ((short)uVar65 < (short)uVar48) * uVar48 |
                     ((short)uVar65 >= (short)uVar48) * uVar65;
            uVar65 = ((short)uVar67 < (short)uVar66) * uVar66 |
                     ((short)uVar67 >= (short)uVar66) * uVar67;
            uVar66 = ((short)uVar71 < (short)uVar68) * uVar68 |
                     ((short)uVar71 >= (short)uVar68) * uVar71;
            uVar67 = ((short)uVar75 < (short)uVar73) * uVar73 |
                     ((short)uVar75 >= (short)uVar73) * uVar75;
            uVar68 = ((short)uVar69 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                     ((short)uVar69 >= (short)(ushort)vF[0]) * uVar69;
            uVar71 = ((short)uVar72 < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                     ((short)uVar72 >= (short)vF[0]._2_2_) * uVar72;
            uVar73 = ((short)uVar74 < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                     ((short)uVar74 >= (short)vF[0]._4_2_) * uVar74;
            uVar75 = ((short)uVar76 < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                     ((short)uVar76 >= (short)vF[0]._6_2_) * uVar76;
            vHM[1]._0_4_ = CONCAT22(uVar65,uVar48);
            vHM[1]._0_6_ = CONCAT24(uVar66,(undefined4)vHM[1]);
            vHM[1] = CONCAT26(uVar67,(undefined6)vHM[1]);
            vH[0]._0_4_ = CONCAT22(uVar71,uVar68);
            vH[0]._0_6_ = CONCAT24(uVar73,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar75,(undefined6)vH[0]);
            a_20[1] = lVar56;
            a_20[0] = (longlong)palVar57;
            b_27[1] = b_24[1];
            mask_20[1] = in_R9;
            mask_20[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_20,b_27,mask_20);
            b_28[0] = alVar82[1];
            a_21[1] = lVar56;
            a_21[0] = (longlong)palVar57;
            b_28[1] = b_24[1];
            mask_21[1] = in_R9;
            mask_21[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_21,b_28,mask_21);
            b_29[0] = alVar82[1];
            a_22[1] = lVar56;
            a_22[0] = (longlong)palVar57;
            b_29[1] = b_24[1];
            mask_22[1] = in_R9;
            mask_22[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_22,b_29,mask_22);
            b_30[0] = alVar82[1];
            a_23[1] = lVar56;
            a_23[0] = (longlong)palVar57;
            b_30[1] = b_24[1];
            mask_23[1] = in_R9;
            mask_23[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_23,b_30,mask_23);
            b_31[0] = alVar82[1];
            a_24[1] = lVar56;
            a_24[0] = (longlong)palVar57;
            b_31[1] = b_24[1];
            mask_24[1] = in_R9;
            mask_24[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_24,b_31,mask_24);
            b_32[0] = alVar82[1];
            a_25[1] = lVar56;
            a_25[0] = (longlong)palVar57;
            b_32[1] = b_24[1];
            mask_25[1] = in_R9;
            mask_25[0] = lVar58;
            alVar82 = _mm_blendv_epi8_rpl(a_25,b_32,mask_25);
            lVar55 = alVar82[1];
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = extraout_XMM0_Qa_06;
            b_03[k][1] = extraout_XMM0_Qb_06;
            b_04[k][0] = extraout_XMM0_Qa_07;
            b_04[k][1] = extraout_XMM0_Qb_07;
            b_05[k][0] = extraout_XMM0_Qa_08;
            b_05[k][1] = extraout_XMM0_Qb_08;
            local_148 = (short)vSaturationCheckMax[1];
            sStack_146 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_144 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_142 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_140 = (short)vSaturationCheckMin[0];
            sStack_13e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_13c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_13a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar67 < sStack_142) * uVar67 |
                          (ushort)((short)uVar67 >= sStack_142) * sStack_142,
                          CONCAT24(((short)uVar66 < sStack_144) * uVar66 |
                                   (ushort)((short)uVar66 >= sStack_144) * sStack_144,
                                   CONCAT22(((short)uVar65 < sStack_146) * uVar65 |
                                            (ushort)((short)uVar65 >= sStack_146) * sStack_146,
                                            ((short)uVar48 < local_148) * uVar48 |
                                            (ushort)((short)uVar48 >= local_148) * local_148)));
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar75 < sStack_13a) * uVar75 |
                          (ushort)((short)uVar75 >= sStack_13a) * sStack_13a,
                          CONCAT24(((short)uVar73 < sStack_13c) * uVar73 |
                                   (ushort)((short)uVar73 >= sStack_13c) * sStack_13c,
                                   CONCAT22(((short)uVar71 < sStack_13e) * uVar71 |
                                            (ushort)((short)uVar71 >= sStack_13e) * sStack_13e,
                                            ((short)uVar68 < sStack_140) * uVar68 |
                                            (ushort)((short)uVar68 >= sStack_140) * sStack_140)));
            local_3a8 = (short)vNegInfFront[1];
            sStack_3a6 = (short)((ulong)vNegInfFront[1] >> 0x10);
            sStack_3a4 = (short)((ulong)vNegInfFront[1] >> 0x20);
            sStack_3a2 = (short)((ulong)vNegInfFront[1] >> 0x30);
            sStack_3a0 = (short)vSaturationCheckMax[0];
            sStack_39e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_39c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_39a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar48 = (local_3a8 < (short)uVar48) * uVar48 |
                     (ushort)(local_3a8 >= (short)uVar48) * local_3a8;
            uVar65 = (sStack_3a6 < (short)uVar65) * uVar65 |
                     (ushort)(sStack_3a6 >= (short)uVar65) * sStack_3a6;
            uVar66 = (sStack_3a4 < (short)uVar66) * uVar66 |
                     (ushort)(sStack_3a4 >= (short)uVar66) * sStack_3a4;
            uVar67 = (sStack_3a2 < (short)uVar67) * uVar67 |
                     (ushort)(sStack_3a2 >= (short)uVar67) * sStack_3a2;
            uVar68 = (sStack_3a0 < (short)uVar68) * uVar68 |
                     (ushort)(sStack_3a0 >= (short)uVar68) * sStack_3a0;
            uVar71 = (sStack_39e < (short)uVar71) * uVar71 |
                     (ushort)(sStack_39e >= (short)uVar71) * sStack_39e;
            uVar73 = (sStack_39c < (short)uVar73) * uVar73 |
                     (ushort)(sStack_39c >= (short)uVar73) * sStack_39c;
            uVar75 = (sStack_39a < (short)uVar75) * uVar75 |
                     (ushort)(sStack_39a >= (short)uVar75) * sStack_39a;
            local_3d8 = (short)extraout_XMM0_Qa_06;
            sStack_3d6 = (short)((ulong)extraout_XMM0_Qa_06 >> 0x10);
            sStack_3d4 = (short)((ulong)extraout_XMM0_Qa_06 >> 0x20);
            sStack_3d2 = (short)((ulong)extraout_XMM0_Qa_06 >> 0x30);
            sStack_3d0 = (short)extraout_XMM0_Qb_06;
            sStack_3ce = (short)((ulong)extraout_XMM0_Qb_06 >> 0x10);
            sStack_3cc = (short)((ulong)extraout_XMM0_Qb_06 >> 0x20);
            sStack_3ca = (short)((ulong)extraout_XMM0_Qb_06 >> 0x30);
            uVar48 = (ushort)((short)uVar48 < local_3d8) * local_3d8 |
                     ((short)uVar48 >= local_3d8) * uVar48;
            uVar65 = (ushort)((short)uVar65 < sStack_3d6) * sStack_3d6 |
                     ((short)uVar65 >= sStack_3d6) * uVar65;
            uVar66 = (ushort)((short)uVar66 < sStack_3d4) * sStack_3d4 |
                     ((short)uVar66 >= sStack_3d4) * uVar66;
            uVar67 = (ushort)((short)uVar67 < sStack_3d2) * sStack_3d2 |
                     ((short)uVar67 >= sStack_3d2) * uVar67;
            uVar68 = (ushort)((short)uVar68 < sStack_3d0) * sStack_3d0 |
                     ((short)uVar68 >= sStack_3d0) * uVar68;
            uVar71 = (ushort)((short)uVar71 < sStack_3ce) * sStack_3ce |
                     ((short)uVar71 >= sStack_3ce) * uVar71;
            uVar73 = (ushort)((short)uVar73 < sStack_3cc) * sStack_3cc |
                     ((short)uVar73 >= sStack_3cc) * uVar73;
            uVar75 = (ushort)((short)uVar75 < sStack_3ca) * sStack_3ca |
                     ((short)uVar75 >= sStack_3ca) * uVar75;
            local_3f8 = (short)extraout_XMM0_Qa_07;
            sStack_3f6 = (short)((ulong)extraout_XMM0_Qa_07 >> 0x10);
            sStack_3f4 = (short)((ulong)extraout_XMM0_Qa_07 >> 0x20);
            sStack_3f2 = (short)((ulong)extraout_XMM0_Qa_07 >> 0x30);
            sStack_3f0 = (short)extraout_XMM0_Qb_07;
            sStack_3ee = (short)((ulong)extraout_XMM0_Qb_07 >> 0x10);
            sStack_3ec = (short)((ulong)extraout_XMM0_Qb_07 >> 0x20);
            sStack_3ea = (short)((ulong)extraout_XMM0_Qb_07 >> 0x30);
            uVar48 = (ushort)((short)uVar48 < local_3f8) * local_3f8 |
                     ((short)uVar48 >= local_3f8) * uVar48;
            uVar65 = (ushort)((short)uVar65 < sStack_3f6) * sStack_3f6 |
                     ((short)uVar65 >= sStack_3f6) * uVar65;
            uVar66 = (ushort)((short)uVar66 < sStack_3f4) * sStack_3f4 |
                     ((short)uVar66 >= sStack_3f4) * uVar66;
            uVar67 = (ushort)((short)uVar67 < sStack_3f2) * sStack_3f2 |
                     ((short)uVar67 >= sStack_3f2) * uVar67;
            uVar68 = (ushort)((short)uVar68 < sStack_3f0) * sStack_3f0 |
                     ((short)uVar68 >= sStack_3f0) * uVar68;
            uVar71 = (ushort)((short)uVar71 < sStack_3ee) * sStack_3ee |
                     ((short)uVar71 >= sStack_3ee) * uVar71;
            uVar73 = (ushort)((short)uVar73 < sStack_3ec) * sStack_3ec |
                     ((short)uVar73 >= sStack_3ec) * uVar73;
            uVar75 = (ushort)((short)uVar75 < sStack_3ea) * sStack_3ea |
                     ((short)uVar75 >= sStack_3ea) * uVar75;
            sVar1 = (short)extraout_XMM0_Qa_08;
            sVar8 = (short)((ulong)extraout_XMM0_Qa_08 >> 0x10);
            sVar9 = (short)((ulong)extraout_XMM0_Qa_08 >> 0x20);
            sVar10 = (short)((ulong)extraout_XMM0_Qa_08 >> 0x30);
            sVar11 = (short)extraout_XMM0_Qb_08;
            sVar12 = (short)((ulong)extraout_XMM0_Qb_08 >> 0x10);
            sVar13 = (short)((ulong)extraout_XMM0_Qb_08 >> 0x20);
            sVar14 = (short)((ulong)extraout_XMM0_Qb_08 >> 0x30);
            vNegInfFront[1] =
                 CONCAT26((ushort)((short)uVar67 < sVar10) * sVar10 |
                          ((short)uVar67 >= sVar10) * uVar67,
                          CONCAT24((ushort)((short)uVar66 < sVar9) * sVar9 |
                                   ((short)uVar66 >= sVar9) * uVar66,
                                   CONCAT22((ushort)((short)uVar65 < sVar8) * sVar8 |
                                            ((short)uVar65 >= sVar8) * uVar65,
                                            (ushort)((short)uVar48 < sVar1) * sVar1 |
                                            ((short)uVar48 >= sVar1) * uVar48)));
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar75 < sVar14) * sVar14 |
                          ((short)uVar75 >= sVar14) * uVar75,
                          CONCAT24((ushort)((short)uVar73 < sVar13) * sVar13 |
                                   ((short)uVar73 >= sVar13) * uVar73,
                                   CONCAT22((ushort)((short)uVar71 < sVar12) * sVar12 |
                                            ((short)uVar71 >= sVar12) * uVar71,
                                            (ushort)((short)uVar68 < sVar11) * sVar11 |
                                            ((short)uVar68 >= sVar11) * uVar68)));
          }
          vH[0] = ptr[iVar53][1];
          vHM[0] = b_03[iVar53][1];
          vHS[0] = b_04[iVar53][1];
          vHL[0] = b_05[iVar53][1];
          vHp[1] = b_05[iVar53][0];
          vHL[1] = b_04[iVar53][0];
          vHS[1] = b_03[iVar53][0];
          vHM[1] = ptr[iVar53][0];
          for (end_query = 0; end_query < iVar50; end_query = end_query + 1) {
            vH[0] = vH[0] << 0x10 | (ulong)vHM[1] >> 0x30;
            vHM[0] = vHM[0] << 0x10 | (ulong)vHS[1] >> 0x30;
            vHS[0] = vHS[0] << 0x10 | (ulong)vHL[1] >> 0x30;
            vHL[0] = vHL[0] << 0x10 | (ulong)vHp[1] >> 0x30;
            vHp[1] = vHp[1] << 0x10;
            vHL[1] = vHL[1] << 0x10;
            vHS[1] = vHS[1] << 0x10;
            vHM[1] = vHM[1] << 0x10;
          }
          *(int *)(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->trace
                    ->trace_del_table + (long)s1Len * 4) = (int)vH[0]._6_2_;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &profile_local->matrix)->trace->trace_del_table + 8) +
                  (long)s1Len * 4) = (int)vHM[0]._6_2_;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &profile_local->matrix)->trace->trace_del_table + 0x10) +
                  (long)s1Len * 4) = (int)vHS[0]._6_2_;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &profile_local->matrix)->trace->trace_del_table + 0x18) +
                  (long)s1Len * 4) = (int)vHL[0]._6_2_;
          vF[1] = vF[1] << 0x10;
        }
        for (k = 0; k < iVar49; k = k + 1) {
          t = k * 0x10;
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = iVar49;
          vH_00[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x20),
                        vH_00,t,(int32_t)lVar58);
          vH_01[0] = (ulong)(uint)k;
          vH_01[1]._0_4_ = iVar49;
          vH_01[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x28),
                        vH_01,t,(int32_t)lVar58);
          vH_02[0] = (ulong)(uint)k;
          vH_02[1]._0_4_ = iVar49;
          vH_02[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x30),
                        vH_02,t,(int32_t)lVar58);
          vH_03[0] = (ulong)(uint)k;
          vH_03[1]._0_4_ = iVar49;
          vH_03[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &profile_local->matrix)->trace->trace_del_table + 0x38),
                        vH_03,t,(int32_t)lVar58);
        }
        vH_2[0] = ptr[iVar53][1];
        vHM_2[0] = b_03[iVar53][1];
        vHS_2[0] = b_04[iVar53][1];
        vHL_2[0] = b_05[iVar53][1];
        uStack_1008 = b_05[iVar53][0];
        vHL_2[1] = b_04[iVar53][0];
        vHS_2[1] = b_03[iVar53][0];
        vHM_2[1] = ptr[iVar53][0];
        for (end_query = 0; end_query < iVar50; end_query = end_query + 1) {
          vH_2[0] = vH_2[0] << 0x10 | (ulong)vHM_2[1] >> 0x30;
          vHM_2[0] = vHM_2[0] << 0x10 | (ulong)vHS_2[1] >> 0x30;
          vHS_2[0] = vHS_2[0] << 0x10 | (ulong)vHL_2[1] >> 0x30;
          vHL_2[0] = vHL_2[0] << 0x10 | uStack_1008 >> 0x30;
          uStack_1008 = uStack_1008 << 0x10;
          vHL_2[1] = vHL_2[1] << 0x10;
          vHS_2[1] = vHS_2[1] << 0x10;
          vHM_2[1] = vHM_2[1] << 0x10;
        }
        local_c4a = vH_2[0]._6_2_;
        local_c4c = vHM_2[0]._6_2_;
        local_c4e = vHS_2[0]._6_2_;
        local_c50 = vHL_2[0]._6_2_;
        local_108 = (short)vSaturationCheckMax[1];
        sStack_106 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_104 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_102 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_100 = (short)vSaturationCheckMin[0];
        sStack_fe = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_fc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_fa = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_508 = (short)vNegInfFront[1];
        sStack_506 = (short)((ulong)vNegInfFront[1] >> 0x10);
        sStack_504 = (short)((ulong)vNegInfFront[1] >> 0x20);
        sStack_502 = (short)((ulong)vNegInfFront[1] >> 0x30);
        sStack_500 = (short)vSaturationCheckMax[0];
        sStack_4fe = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_4fc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_4fa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar54 = CONCAT26(-(ushort)(sStack_fa < (short)uVar46),
                          CONCAT24(-(ushort)(sStack_fc < (short)uVar46),
                                   CONCAT22(-(ushort)(sStack_fe < (short)uVar46),
                                            -(ushort)(sStack_100 < (short)uVar46)))) |
                 CONCAT26(-(ushort)(sVar47 < sStack_4fa),
                          CONCAT24(-(ushort)(sVar47 < sStack_4fc),
                                   CONCAT22(-(ushort)(sVar47 < sStack_4fe),
                                            -(ushort)(sVar47 < sStack_500))));
        auVar39._8_8_ = uVar54;
        auVar39._0_8_ =
             CONCAT26(-(ushort)(sStack_102 < (short)uVar46),
                      CONCAT24(-(ushort)(sStack_104 < (short)uVar46),
                               CONCAT22(-(ushort)(sStack_106 < (short)uVar46),
                                        -(ushort)(local_108 < (short)uVar46)))) |
             CONCAT26(-(ushort)(sVar47 < sStack_502),
                      CONCAT24(-(ushort)(sVar47 < sStack_504),
                               CONCAT22(-(ushort)(sVar47 < sStack_506),-(ushort)(sVar47 < local_508)
                                       )));
        if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar39 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar39 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar39 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar39 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar39 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar54 >> 7 & 1) != 0) || (uVar54 >> 0xf & 1) != 0) || (uVar54 >> 0x17 & 1) != 0)
               || (uVar54 >> 0x1f & 1) != 0) || (uVar54 >> 0x27 & 1) != 0) ||
             (uVar54 >> 0x2f & 1) != 0) || (uVar54 >> 0x37 & 1) != 0) || (long)uVar54 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_c4a = 0;
          local_c4c = 0;
          local_c4e = 0;
          local_c50 = 0;
          local_b40 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)local_c4a;
        *(int *)((long)&profile_local->s1 + 4) = local_b40;
        profile_local->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->extra =
             (int)local_c4c;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)local_c4e;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)local_c50;
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}